

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall embree::SceneGraph::Transformations::~Transformations(Transformations *this)

{
  long in_RDI;
  size_t i;
  void *in_stack_ffffffffffffffb8;
  undefined8 local_28;
  
  for (local_28 = 0; local_28 < *(ulong *)(in_RDI + 0x10); local_28 = local_28 + 1) {
  }
  alignedFree(in_stack_ffffffffffffffb8);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

__forceinline Transformations() {}